

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_utils.hpp
# Opt level: O2

void ELFIO::adjust_stream_size(ostream *stream,streamsize offset)

{
  char cVar1;
  long lVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::ostream::seekp((long)stream,_S_beg);
  lVar2 = std::ostream::tellp();
  if (lVar2 < offset) {
    cVar1 = std::ostream::tellp();
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct((ulong)local_40,(char)offset - cVar1);
    std::ostream::write((char *)stream,(long)local_40[0]);
    std::__cxx11::string::~string((string *)local_40);
  }
  std::ostream::seekp(stream,offset,0);
  return;
}

Assistant:

inline void adjust_stream_size( std::ostream& stream, std::streamsize offset )
{
    stream.seekp( 0, std::ios_base::end );
    if ( stream.tellp() < offset ) {
        std::streamsize size = offset - stream.tellp();
        stream.write( std::string( size_t( size ), '\0' ).c_str(), size );
    }
    stream.seekp( offset );
}